

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

void __thiscall OjaNewton::compute_delta(OjaNewton *this)

{
  long lVar1;
  float fVar2;
  
  (this->data).bdelta = 0.0;
  if (0 < this->m) {
    lVar1 = 0;
    do {
      fVar2 = this->learning_rate_cnt / (float)this->t;
      if (1.0 <= fVar2) {
        fVar2 = 1.0;
      }
      (this->data).delta[lVar1 + 1] = fVar2 * (this->data).Zx[lVar1 + 1] * (this->data).sketch_cnt;
      (this->data).bdelta = (this->data).delta[lVar1 + 1] * this->b[lVar1 + 1] + (this->data).bdelta
      ;
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->m);
  }
  return;
}

Assistant:

void compute_delta()
  {
    data.bdelta = 0;
    for (int i = 1; i <= m; i++)
    {
      float gamma = fmin(learning_rate_cnt / t, 1.f);

      // if different learning rates are used
      /*data.delta[i] = gamma * data.AZx[i] * data.sketch_cnt;
      for (int j = 1; j < i; j++) {
          data.delta[i] -= A[i][j] * data.delta[j];
      }
      data.delta[i] /= A[i][i];*/

      // if a same learning rate is used
      data.delta[i] = gamma * data.Zx[i] * data.sketch_cnt;

      data.bdelta += data.delta[i] * b[i];
    }
  }